

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O0

void __thiscall xray_re::se_smart_terrain::state_write(se_smart_terrain *this,xr_packet *packet)

{
  xr_packet *pxVar1;
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  xr_packet *local_18;
  xr_packet *packet_local;
  se_smart_terrain *this_local;
  
  local_18 = packet;
  packet_local = (xr_packet *)this;
  cse_alife_smart_zone::state_write((cse_alife_smart_zone *)this,packet);
  if (*(ushort *)&this->field_0x28 < 0x80) {
    if (*(ushort *)&this->field_0x28 < 0x7a) {
      if (*(short *)&this->field_0x28 == 0x76) {
        w_ctime(local_18,false);
        w_ctime(local_18,false);
        (*local_18->_vptr_xr_packet[0xc])(local_18,0);
      }
      else {
        if (*(short *)&this->field_0x28 != 0x65) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                        ,0x242,"virtual void xray_re::se_smart_terrain::state_write(xr_packet &)");
        }
        (*local_18->_vptr_xr_packet[10])();
        w_ctime(local_18,false);
        w_ctime(local_18,false);
        (*local_18->_vptr_xr_packet[10])(local_18,0);
      }
    }
    else {
      if (0x7c < *(ushort *)&this->field_0x28) {
        __assert_fail("m_version <= CSE_VERSION_CS",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x21d,"virtual void xray_re::se_smart_terrain::state_write(xr_packet &)");
      }
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,false,"se_smart_terrain");
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,false,"CCombat_manager");
      (*local_18->_vptr_xr_packet[0xc])(local_18,0);
      pxVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_38,"nil",&local_39);
      (*pxVar1->_vptr_xr_packet[4])(pxVar1,local_38);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator(&local_39);
      (*local_18->_vptr_xr_packet[8])(local_18,0xffff);
      pxVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_70,"nil",&local_71);
      (*pxVar1->_vptr_xr_packet[4])(pxVar1,local_70);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator(&local_71);
      (*local_18->_vptr_xr_packet[0xc])(local_18,0);
      (*local_18->_vptr_xr_packet[10])(local_18,0);
      (*local_18->_vptr_xr_packet[0xc])(local_18,0);
      (*local_18->_vptr_xr_packet[10])(local_18,0);
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,false,"CCover_manager");
      (*local_18->_vptr_xr_packet[0xc])(local_18,0);
      (*local_18->_vptr_xr_packet[10])(local_18,0);
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,true,"CCover_manager");
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,true,"CCombat_manager");
      (*local_18->_vptr_xr_packet[10])(local_18,0);
      (*local_18->_vptr_xr_packet[10])(local_18,0);
      cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,true,"se_smart_terrain");
    }
  }
  else {
    if (0x80 < *(ushort *)&this->field_0x28) {
      __assert_fail("m_version <= CSE_VERSION_COP",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x20f,"virtual void xray_re::se_smart_terrain::state_write(xr_packet &)");
    }
    cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,false,"se_smart_terrain");
    (*local_18->_vptr_xr_packet[10])(local_18,(ulong)this->arriving_npc_count);
    (*local_18->_vptr_xr_packet[10])(local_18,(ulong)this->npc_info_count);
    (*local_18->_vptr_xr_packet[10])(local_18,(ulong)this->dead_time_count);
    (*local_18->_vptr_xr_packet[10])(local_18,(ulong)this->base_on_actor_control_present);
    (*local_18->_vptr_xr_packet[10])(local_18,(ulong)this->is_respawn_point);
    (*local_18->_vptr_xr_packet[10])(local_18,(ulong)this->population);
    cse_abstract::set_save_marker((cse_abstract *)this,local_18,SM_SAVE,true,"se_smart_terrain");
  }
  return;
}

Assistant:

void se_smart_terrain::state_write(xr_packet& packet)
{
	cse_alife_smart_zone::state_write(packet);
	if (m_version >= CSE_VERSION_0x80) {
		xr_assert(m_version <= CSE_VERSION_COP);

		set_save_marker(packet, SM_SAVE, false, "se_smart_terrain");
	
	    packet.w_u8(arriving_npc_count);
	    packet.w_u8(npc_info_count);
	    packet.w_u8(dead_time_count);
	    packet.w_u8(base_on_actor_control_present);
	    packet.w_u8(is_respawn_point);
	    packet.w_u8(population);
	  
	  set_save_marker(packet, SM_SAVE, true, "se_smart_terrain");
	}
	else if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);

		set_save_marker(packet, SM_SAVE, false, "se_smart_terrain");

		// CCombat_manager
		set_save_marker(packet, SM_SAVE, false, "CCombat_manager");
		packet.w_bool(false);
		packet.w_sz("nil");
		packet.w_u16(0xffff);
		packet.w_sz("nil");
		packet.w_bool(false);
		packet.w_u8(0);
		packet.w_bool(false);
		packet.w_u8(0);

		// CCover_manager
		set_save_marker(packet, SM_SAVE, false, "CCover_manager");
		packet.w_bool(false);
		packet.w_u8(0);
		set_save_marker(packet, SM_SAVE, true, "CCover_manager");
		set_save_marker(packet, SM_SAVE, true, "CCombat_manager");

		// actual se_smart_terrain
		packet.w_u8(0);
		packet.w_u8(0);

		set_save_marker(packet, SM_SAVE, true, "se_smart_terrain");
	} else if (m_version == CSE_VERSION_SOC) {
		w_ctime(packet);
		w_ctime(packet);
		packet.w_bool(false);
	} else if (m_version == CSE_VERSION_2215) {
		packet.w_u8(0);
		w_ctime(packet);
		w_ctime(packet);
		packet.w_u8(0);
	} else {
		xr_not_implemented();
	}
}